

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

void path_add(path_state_t *state,char *path)

{
  char *local_38;
  size_t len;
  char *tmp;
  char *dir_path;
  char *path_local;
  path_state_t *state_local;
  
  if (path == (char *)0x0) {
    local_38 = (char *)0x0;
  }
  else {
    local_38 = util_shortname(path);
  }
  if (path == local_38) {
    tmp = (char *)malloc(1);
    *tmp = '\0';
  }
  else {
    local_38 = local_38 + (-1 - (long)path);
    tmp = (char *)malloc((size_t)(local_38 + 1));
    memcpy(tmp,path,(size_t)local_38);
    tmp[(long)local_38] = '\0';
  }
  list_append_new(&state->path_list,tmp);
  return;
}

Assistant:

void
path_add(
    path_state_t* state,
    char* path)
{
    char* dir_path;
    const char* tmp = path ? util_shortname(path) : NULL; /* NULL check is needed for stdin */
    if (path != tmp) {
        size_t len = tmp-1 - path;
        dir_path = malloc(len + 1);
        memcpy(dir_path, path, len);
        dir_path[len] = '\0';
    } else {
        dir_path = malloc(1);
        dir_path[0] = '\0';
    }

    list_append_new(&state->path_list, (void*)dir_path);
}